

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-product.c
# Opt level: O1

int coda_get_product_root_type(coda_product *product,coda_type **type)

{
  coda_type *pcVar1;
  undefined8 uVar2;
  char *message;
  
  if (product == (coda_product *)0x0) {
    message = "product file argument is NULL (%s:%u)";
    uVar2 = 0x410;
  }
  else {
    if (type != (coda_type **)0x0) {
      if (((product->product_definition == (coda_product_definition *)0x0) ||
          (pcVar1 = product->product_definition->root_type, pcVar1 == (coda_type *)0x0)) &&
         (pcVar1 = (coda_type *)product->root_type, 99 < pcVar1->format)) {
        pcVar1 = *(coda_type **)&pcVar1->type_class;
      }
      *type = pcVar1;
      return 0;
    }
    message = "type argument is NULL (%s:%u)";
    uVar2 = 0x415;
  }
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                 ,uVar2);
  return -1;
}

Assistant:

LIBCODA_API int coda_get_product_root_type(const coda_product *product, coda_type **type)
{
    if (product == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "product file argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (product->product_definition != NULL && product->product_definition->root_type != NULL)
    {
        *type = product->product_definition->root_type;
    }
    else
    {
        *type = coda_get_type_for_dynamic_type(product->root_type);
    }

    return 0;
}